

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O0

double sptk::KaiserWindow::AttenuationToBeta(double attenuation)

{
  double in_XMM0_Qa;
  double dVar1;
  double a_1;
  double a;
  double beta;
  undefined8 local_10;
  
  if (21.0 < in_XMM0_Qa) {
    if (50.0 < in_XMM0_Qa) {
      local_10 = (in_XMM0_Qa - 8.7) * 0.1102;
    }
    else {
      dVar1 = pow(in_XMM0_Qa - 21.0,0.4);
      local_10 = dVar1 * 0.5842 + (in_XMM0_Qa - 21.0) * 0.07886;
    }
  }
  else {
    local_10 = 0.0;
  }
  return local_10;
}

Assistant:

double KaiserWindow::AttenuationToBeta(double attenuation) {
  double beta;
  if (attenuation <= 21.0) {
    beta = 0.0;
  } else if (attenuation <= 50.0) {
    const double a(attenuation - 21.0);
    beta = 0.5842 * std::pow(a, 0.4) + 0.07886 * a;
  } else {
    const double a(attenuation - 8.7);
    beta = 0.1102 * a;
  }
  return beta;
}